

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O0

void check_input(uchar **from0,size_t n0)

{
  int iVar1;
  ulong local_28;
  size_t i_1;
  size_t i;
  size_t n0_local;
  uchar **from0_local;
  
  for (i_1 = 1; i_1 < n0; i_1 = i_1 + 1) {
    cmp(from0[i_1 - 1],from0[i_1]);
  }
  local_28 = 1;
  while( true ) {
    if (n0 <= local_28) {
      return;
    }
    iVar1 = cmp(from0[local_28 - 1],from0[local_28]);
    if (0 < iVar1) break;
    local_28 = local_28 + 1;
  }
  __assert_fail("cmp(from0[i-1],from0[i])<=0",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                ,0x6c,"void check_input(unsigned char **, size_t)");
}

Assistant:

static void
check_input(unsigned char** from0, size_t n0)
{
	(void) from0;
	(void) n0;
#ifndef NDEBUG
	for(size_t i=1;i<n0;++i)if(cmp(from0[i-1],from0[i])>0){
		debug()<<"Oops: ''"<<from0[i-1]<<"'' > ''"<<from0[i]<<"''\n";}
	for(size_t i=1;i<n0;++i)assert(cmp(from0[i-1],from0[i])<=0);
#endif
}